

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_GetPrototypePrimitive(JSContext *ctx,JSValue val)

{
  long lVar1;
  JSValue JVar2;
  long lStack_8;
  
  lVar1 = 0x48;
  lStack_8 = 0x40;
  switch(val.u._0_4_) {
  case 0:
    break;
  case 1:
    lVar1 = 0x68;
    lStack_8 = 0x60;
    break;
  case -8:
    lVar1 = 0x78;
    lStack_8 = 0x70;
    break;
  case -7:
    lVar1 = 0x58;
    lStack_8 = 0x50;
    break;
  case -6:
  case -5:
  case -4:
  case -3:
  case -2:
  case -1:
switchD_00119192_caseD_fffffffa:
    return (JSValue)(ZEXT816(2) << 0x40);
  default:
    if (val.u._0_4_ != 7) goto switchD_00119192_caseD_fffffffa;
  }
  JVar2.tag = *(int64_t *)((long)&ctx->class_proto->u + lVar1);
  JVar2.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto->u + lStack_8))->ptr;
  return JVar2;
}

Assistant:

static JSValueConst JS_GetPrototypePrimitive(JSContext *ctx, JSValueConst val)
{
    switch(JS_VALUE_GET_NORM_TAG(val)) {
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        val = ctx->class_proto[JS_CLASS_BIG_INT];
        break;
    case JS_TAG_BIG_FLOAT:
        val = ctx->class_proto[JS_CLASS_BIG_FLOAT];
        break;
    case JS_TAG_BIG_DECIMAL:
        val = ctx->class_proto[JS_CLASS_BIG_DECIMAL];
        break;
#endif
    case JS_TAG_INT:
    case JS_TAG_FLOAT64:
        val = ctx->class_proto[JS_CLASS_NUMBER];
        break;
    case JS_TAG_BOOL:
        val = ctx->class_proto[JS_CLASS_BOOLEAN];
        break;
    case JS_TAG_STRING:
        val = ctx->class_proto[JS_CLASS_STRING];
        break;
    case JS_TAG_SYMBOL:
        val = ctx->class_proto[JS_CLASS_SYMBOL];
        break;
    case JS_TAG_OBJECT:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
    default:
        val = JS_NULL;
        break;
    }
    return val;
}